

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form1_Merge(MergeForm1 Merge)

{
  bool bVar1;
  Image output;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  ImageTemplate<unsigned_char> local_68;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  Unit_Test::intensityArray(&local_28,3);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_68,0,0,'\x01','\x01');
  Test_Helper::uniformImages(&local_40,&local_28,&local_68);
  local_68._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_68);
  (*Merge)(&local_68,
           local_40.
           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start,
           local_40.
           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1,
           local_40.
           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 2);
  bVar1 = Unit_Test::verifyImage(&local_68,&local_28,false);
  if (bVar1) {
    bVar1 = Unit_Test::equalSize
                      (&local_68,
                       (local_40.
                        super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_width,
                       (local_40.
                        super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_height);
    if (bVar1) {
      bVar1 = local_68._colorCount == '\x03';
      goto LAB_0015432f;
    }
  }
  bVar1 = false;
LAB_0015432f:
  local_68._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_68);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&local_40);
  if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool form1_Merge(MergeForm1 Merge)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        std::vector < PenguinV_Image::Image > input = uniformImages( intensity );

        const PenguinV_Image::Image output = Merge( input[0], input[1], input[2] );

        return verifyImage( output, intensity, false ) && equalSize( output, input[0].width(), input[0].height() ) && (output.colorCount() == PenguinV_Image::RGB);
    }